

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-data.hpp
# Opt level: O0

vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
* __thiscall
helics::FilterOperator::processVector
          (FilterOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  bool bVar1;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *in_RSI;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *in_RDI;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> res;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *ret;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *this_00;
  undefined1 local_30 [8];
  undefined1 local_28 [15];
  byte local_19;
  
  local_19 = 0;
  this_00 = in_RDI;
  CLI::std::
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::vector((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            *)0x44d118);
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)this_00,
             (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)in_RDI);
  (*(code *)(in_RSI->
            super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start[2]._M_t.
            super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t)
            (local_28,in_RSI,local_30);
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)this_00);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x44d15a)
  ;
  if (bVar1) {
    CLI::std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::push_back(this_00,(value_type *)in_RDI);
  }
  local_19 = 1;
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)this_00);
  if ((local_19 & 1) == 0) {
    CLI::std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::~vector(in_RSI);
  }
  return (vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          *)this_00;
}

Assistant:

virtual std::vector<std::unique_ptr<Message>> processVector(std::unique_ptr<Message> message)
    {
        std::vector<std::unique_ptr<Message>> ret;
        auto res = process(std::move(message));
        if (res) {
            ret.push_back(std::move(res));
        }
        return ret;
    }